

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_get_rel_pos(ggml_context *ctx,ggml_tensor *a,int qh,int kh)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  int64_t ne [4];
  int64_t local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  if (qh == kh) {
    if (a->ne[1] == (long)(kh * 2 + -1)) {
      local_28 = a->ne[0];
      local_20 = (long)kh;
      local_18 = (long)qh;
      local_10 = 1;
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F16,3,&local_28,(ggml_tensor *)0x0,0);
      pgVar1->op = GGML_OP_GET_REL_POS;
      pgVar1->src[0] = a;
      return pgVar1;
    }
    pcVar2 = "2*MAX(qh, kh) - 1 == a->ne[1]";
    line = 0x123a;
  }
  else {
    pcVar2 = "qh == kh";
    line = 0x1239;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_get_rel_pos(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   qh,
        int                   kh) {
    GGML_ASSERT(qh == kh);
    GGML_ASSERT(2*MAX(qh, kh) - 1 == a->ne[1]);

    const int64_t ne[4] = { a->ne[0], kh, qh, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F16, 3, ne);

    result->op     = GGML_OP_GET_REL_POS;
    result->src[0] = a;

    return result;
}